

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O0

genxAttribute_conflict
declareAttribute(genxWriter w,genxNamespace ns,constUtf8 name,constUtf8 valuestr,genxStatus *statusP
                )

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  genxStatus gVar4;
  genxWriter w_00;
  undefined4 extraout_var;
  long in_RCX;
  EVP_PKEY_CTX *in_RDX;
  char *in_RSI;
  FILE *in_RDI;
  undefined4 *in_R8;
  int probe;
  genxAttribute_conflict a;
  genxAttribute_conflict *aa;
  int low;
  int high;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_38;
  int local_34;
  
  pcVar1 = in_RDI[0x130]._IO_read_ptr;
  in_RDI[0x130]._IO_backup_base = in_RSI;
  in_RDI[0x130]._IO_save_base = (char *)in_RDX;
  if (in_RSI == (char *)0x0) {
    iVar3 = strncmp((char *)in_RDX,"xmlns",5);
    if (iVar3 == 0) {
      *(undefined4 *)((long)&in_RDI[0x130]._chain + 4) = 0;
    }
    else {
      *(undefined4 *)((long)&in_RDI[0x130]._chain + 4) = 1;
    }
  }
  else {
    *(undefined4 *)((long)&in_RDI[0x130]._chain + 4) = 2;
  }
  if ((in_RSI == (char *)0x0) || (*(long *)(in_RSI + 0x20) != in_RDI[0x12f]._offset)) {
    local_34 = in_RDI[0x130]._flags;
    local_38 = -1;
    iVar3 = local_38;
    while (local_38 = iVar3, 1 < local_34 - local_38) {
      in_stack_ffffffffffffffb4 = (local_34 + local_38) / 2;
      iVar2 = orderAttributes((genxAttribute_conflict)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                              (genxAttribute_conflict)0x280d7d);
      iVar3 = in_stack_ffffffffffffffb4;
      if (iVar2 < 0) {
        iVar3 = local_38;
        local_34 = in_stack_ffffffffffffffb4;
      }
    }
    if ((local_38 != -1) &&
       (iVar3 = orderAttributes((genxAttribute_conflict)
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                (genxAttribute_conflict)0x280dbc), iVar3 == 0)) {
      return *(genxAttribute_conflict *)(pcVar1 + (long)local_38 * 8);
    }
    w_00 = (genxWriter)
           allocate((genxWriter)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    if (w_00 == (genxWriter)0x0) {
      *(undefined4 *)&in_RDI->_IO_read_end = 4;
    }
    else {
      w_00->file = in_RDI;
      *(char **)&w_00->status = in_RSI;
      w_00->xmlChars[0x10] = '\0';
      w_00->xmlChars[0x11] = '\0';
      w_00->xmlChars[0x12] = '\0';
      w_00->xmlChars[0x13] = '\0';
      *(undefined4 *)(w_00->xmlChars + 0x14) = *(undefined4 *)((long)&in_RDI[0x130]._chain + 4);
      iVar3 = copy((EVP_PKEY_CTX *)in_RDI,in_RDX);
      w_00->sender = (genxSender *)CONCAT44(extraout_var,iVar3);
      if ((genxSender *)CONCAT44(extraout_var,iVar3) == (genxSender *)0x0) {
        *(undefined4 *)&in_RDI->_IO_read_end = 4;
      }
      else {
        gVar4 = initCollector((genxWriter)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                              (collector *)0x280e82);
        *(genxStatus *)&in_RDI->_IO_read_end = gVar4;
        if (gVar4 == GENX_SUCCESS) {
          if (in_RCX != 0) {
            gVar4 = collectString(w_00,(collector *)
                                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                                  ,(constUtf8)
                                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
            *(genxStatus *)&in_RDI->_IO_read_end = gVar4;
            if (gVar4 != GENX_SUCCESS) goto LAB_00280f0a;
          }
          gVar4 = listInsert((plist *)w_00,
                             (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             in_stack_ffffffffffffffac);
          *(genxStatus *)&in_RDI->_IO_read_end = gVar4;
          if (*(int *)&in_RDI->_IO_read_end == 0) {
            *in_R8 = 0;
            return (genxAttribute_conflict)w_00;
          }
        }
      }
    }
  }
  else {
    *(undefined4 *)&in_RDI->_IO_read_end = 0x10;
  }
LAB_00280f0a:
  *in_R8 = *(undefined4 *)&in_RDI->_IO_read_end;
  return (genxAttribute_conflict)0x0;
}

Assistant:

static genxAttribute declareAttribute(genxWriter w, genxNamespace ns,
				      constUtf8 name, constUtf8 valuestr,
				      genxStatus * statusP)
{
  int high, low;
  genxAttribute * aa = (genxAttribute *) w->attributes.pointers;
  genxAttribute a;

  w->arec.ns = ns;
  w->arec.name = (utf8) name;

  if (ns)
    w->arec.atype = ATTR_PREFIXED;
  else if (strncmp((const char *) name, "xmlns", STRLEN_XMLNS_COLON - 1) == 0)
    w->arec.atype = ATTR_NSDECL;
  else
    w->arec.atype = ATTR_NAKED;

  if (ns && (ns->defaultDecl == w->xmlnsEquals))
  {
    w->status = GENX_ATTRIBUTE_IN_DEFAULT_NAMESPACE;
    goto busted;
  }

  /* attribute list has to be kept sorted per c14n rules */
  high = w->attributes.count; low = -1;
  while (high - low > 1)
  {
    int probe = (high + low) / 2;
    if (orderAttributes(&w->arec, aa[probe]) < 0)
      high = probe;
    else
      low = probe;
  }

  /* if it was already there */
  if (low != -1 && orderAttributes(&w->arec, aa[low]) == 0)
    return aa[low];

  /* not there, build it */
  a = (genxAttribute) allocate(w, sizeof(struct genxAttribute_rec));
  if (a == NULL)
  {
    w->status = GENX_ALLOC_FAILED;
    goto busted;
  }

  a->writer = w;
  a->ns = ns;
  a->provided = False;
  a->atype = w->arec.atype;

  if ((a->name = copy(w, name)) == NULL)
  {
    w->status = GENX_ALLOC_FAILED;
    goto busted;
  }

  if ((w->status = initCollector(w, &a->value)) != GENX_SUCCESS)
    goto busted;

  if (valuestr)
    if ((w->status = collectString(w, &a->value, valuestr)) != GENX_SUCCESS)
      goto busted;
  
  w->status = listInsert(&w->attributes, a, high);
  if (w->status != GENX_SUCCESS)
    goto busted;
  
  *statusP = GENX_SUCCESS;
  return a;

busted:
  *statusP = w->status;
  return NULL;
}